

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitAig.c
# Opt level: O0

Aig_Obj_t * Kit_GraphToAigInternal(Aig_Man_t *pMan,Kit_Graph_t *pGraph)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Kit_Node_t *pKVar3;
  Aig_Obj_t *p1;
  int local_3c;
  int i;
  Aig_Obj_t *pAnd1;
  Aig_Obj_t *pAnd0;
  Kit_Node_t *pNode;
  Kit_Graph_t *pGraph_local;
  Aig_Man_t *pMan_local;
  
  pAnd0 = (Aig_Obj_t *)0x0;
  iVar1 = Kit_GraphIsConst(pGraph);
  if (iVar1 == 0) {
    iVar1 = Kit_GraphIsVar(pGraph);
    if (iVar1 == 0) {
      for (local_3c = pGraph->nLeaves; local_3c < pGraph->nSize; local_3c = local_3c + 1) {
        pAnd0 = (Aig_Obj_t *)Kit_GraphNode(pGraph,local_3c);
        pKVar3 = Kit_GraphNode(pGraph,(uint)(pAnd0->field_0).CioId >> 1 & 0x3fffffff);
        pAVar2 = Aig_NotCond((Aig_Obj_t *)(pKVar3->field_2).pFunc,(pAnd0->field_0).CioId & 1);
        pKVar3 = Kit_GraphNode(pGraph,(uint)*(Kit_Edge_t *)((long)&pAnd0->field_0 + 4) >> 1 &
                                      0x3fffffff);
        p1 = Aig_NotCond((Aig_Obj_t *)(pKVar3->field_2).pFunc,
                         (uint)*(Kit_Edge_t *)((long)&pAnd0->field_0 + 4) & 1);
        pAVar2 = Aig_And(pMan,pAVar2,p1);
        ((anon_union_8_2_00c7e208_for_Kit_Node_t__2 *)&pAnd0->pFanin0)->pFunc = pAVar2;
      }
      pAVar2 = pAnd0->pFanin0;
      iVar1 = Kit_GraphIsComplement(pGraph);
      pMan_local = (Aig_Man_t *)Aig_NotCond(pAVar2,iVar1);
    }
    else {
      pKVar3 = Kit_GraphVar(pGraph);
      pAVar2 = (Aig_Obj_t *)(pKVar3->field_2).pFunc;
      iVar1 = Kit_GraphIsComplement(pGraph);
      pMan_local = (Aig_Man_t *)Aig_NotCond(pAVar2,iVar1);
    }
  }
  else {
    pAVar2 = Aig_ManConst1(pMan);
    iVar1 = Kit_GraphIsComplement(pGraph);
    pMan_local = (Aig_Man_t *)Aig_NotCond(pAVar2,iVar1);
  }
  return (Aig_Obj_t *)pMan_local;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Transforms the decomposition graph into the AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Obj_t * Kit_GraphToAigInternal( Aig_Man_t * pMan, Kit_Graph_t * pGraph )
{
    Kit_Node_t * pNode = NULL;
    Aig_Obj_t * pAnd0, * pAnd1;
    int i;
    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Aig_NotCond( Aig_ManConst1(pMan), Kit_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Aig_NotCond( (Aig_Obj_t *)Kit_GraphVar(pGraph)->pFunc, Kit_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Aig_NotCond( (Aig_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Aig_NotCond( (Aig_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Aig_And( pMan, pAnd0, pAnd1 );
    }
    // complement the result if necessary
    return Aig_NotCond( (Aig_Obj_t *)pNode->pFunc, Kit_GraphIsComplement(pGraph) );
}